

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void datetimeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  byte *z;
  long in_FS_OFFSET;
  DateTime x;
  char zBuf [32];
  DateTime DStack_68;
  byte local_38;
  byte local_37;
  byte local_36;
  byte local_35;
  byte local_34;
  undefined1 local_33;
  char local_32;
  char local_31;
  undefined1 local_30;
  char local_2f;
  char local_2e;
  undefined1 local_2d;
  char local_2c;
  char local_2b;
  undefined1 local_2a;
  char local_29;
  char local_28;
  undefined1 local_27;
  char local_26;
  char local_25;
  undefined1 local_24;
  char local_23;
  char local_22;
  char local_21;
  undefined1 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = isDate(context,argc,argv,&DStack_68);
  if (iVar3 == 0) {
    computeYMD(&DStack_68);
    computeHMS(&DStack_68);
    uVar1 = -DStack_68.Y;
    if (0 < DStack_68.Y) {
      uVar1 = DStack_68.Y;
    }
    uVar5 = (ulong)uVar1;
    local_37 = (char)(uVar1 / 1000) + (char)((uVar5 / 1000) * 0x1999999a >> 0x20) * -10 | 0x30;
    local_36 = (char)(uVar1 / 100) + (char)((uVar5 / 100) * 0x1999999a >> 0x20) * -10 | 0x30;
    cVar2 = (char)(uVar1 / 10);
    local_35 = cVar2 + (char)((uVar5 / 10) * 0x1999999a >> 0x20) * -10 | 0x30;
    local_34 = (char)uVar1 + (cVar2 + (char)(uVar1 / 10)) * -5 | 0x30;
    local_33 = 0x2d;
    cVar2 = (char)(DStack_68.M / 10);
    local_32 = cVar2 + (char)((DStack_68.M / 10) / 10) * -10 + '0';
    local_31 = (char)DStack_68.M + cVar2 * -10 + '0';
    local_30 = 0x2d;
    cVar2 = (char)(DStack_68.D / 10);
    local_2f = cVar2 + (char)((DStack_68.D / 10) / 10) * -10 + '0';
    local_2e = (char)DStack_68.D + cVar2 * -10 + '0';
    local_2d = 0x20;
    cVar2 = (char)(DStack_68.h / 10);
    local_2c = cVar2 + (char)((DStack_68.h / 10) / 10) * -10 + '0';
    local_2b = (char)DStack_68.h + cVar2 * -10 + '0';
    local_2a = 0x3a;
    cVar2 = (char)(DStack_68.m / 10);
    local_29 = cVar2 + (char)((DStack_68.m / 10) / 10) * -10 + '0';
    local_28 = (char)DStack_68.m + cVar2 * -10 + '0';
    local_27 = 0x3a;
    if (DStack_68.useSubsec == '\0') {
      iVar3 = (int)DStack_68.s / 10;
      local_26 = (char)iVar3 +
                 ((char)(uint)((ulong)((long)iVar3 * 0x66666667) >> 0x22) - (char)(iVar3 >> 0x1f)) *
                 -10;
      local_25 = (char)(int)DStack_68.s + (char)iVar3 * -10;
      local_24 = 0;
      iVar3 = 0x14;
    }
    else {
      iVar4 = (int)(DStack_68.s * 1000.0 + 0.5);
      iVar3 = iVar4 / 10000;
      local_26 = (char)iVar3 +
                 ((char)(uint)((ulong)((long)iVar3 * 0x66666667) >> 0x22) - (char)(iVar3 >> 0x1f)) *
                 -10;
      iVar3 = iVar4 / 1000;
      local_25 = (char)iVar3 +
                 ((char)(uint)((ulong)((long)iVar3 * 0x66666667) >> 0x22) - (char)(iVar3 >> 0x1f)) *
                 -10;
      local_24 = 0x2e;
      iVar3 = iVar4 / 100;
      local_23 = (char)iVar3 +
                 ((char)(uint)((ulong)((long)iVar3 * 0x66666667) >> 0x22) - (char)(iVar3 >> 0x1f)) *
                 -10 + '0';
      iVar3 = iVar4 / 10;
      local_22 = (char)iVar3 +
                 ((char)(uint)((ulong)((long)iVar3 * 0x66666667) >> 0x22) - (char)(iVar3 >> 0x1f)) *
                 -10 + '0';
      local_21 = (char)iVar4 + (char)iVar3 * -10 + '0';
      local_20 = 0;
      iVar3 = 0x18;
    }
    local_25 = local_25 + '0';
    local_26 = local_26 + '0';
    if (DStack_68.Y < 0) {
      z = &local_38;
      local_38 = 0x2d;
    }
    else {
      z = &local_37;
      iVar3 = iVar3 + -1;
    }
    setResultStrOrError(context,(char *)z,iVar3,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void datetimeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    int Y, s, n;
    char zBuf[32];
    computeYMD_HMS(&x);
    Y = x.Y;
    if( Y<0 ) Y = -Y;
    zBuf[1] = '0' + (Y/1000)%10;
    zBuf[2] = '0' + (Y/100)%10;
    zBuf[3] = '0' + (Y/10)%10;
    zBuf[4] = '0' + (Y)%10;
    zBuf[5] = '-';
    zBuf[6] = '0' + (x.M/10)%10;
    zBuf[7] = '0' + (x.M)%10;
    zBuf[8] = '-';
    zBuf[9] = '0' + (x.D/10)%10;
    zBuf[10] = '0' + (x.D)%10;
    zBuf[11] = ' ';
    zBuf[12] = '0' + (x.h/10)%10;
    zBuf[13] = '0' + (x.h)%10;
    zBuf[14] = ':';
    zBuf[15] = '0' + (x.m/10)%10;
    zBuf[16] = '0' + (x.m)%10;
    zBuf[17] = ':';
    if( x.useSubsec ){
      s = (int)(1000.0*x.s + 0.5);
      zBuf[18] = '0' + (s/10000)%10;
      zBuf[19] = '0' + (s/1000)%10;
      zBuf[20] = '.';
      zBuf[21] = '0' + (s/100)%10;
      zBuf[22] = '0' + (s/10)%10;
      zBuf[23] = '0' + (s)%10;
      zBuf[24] = 0;
      n = 24;
    }else{
      s = (int)x.s;
      zBuf[18] = '0' + (s/10)%10;
      zBuf[19] = '0' + (s)%10;
      zBuf[20] = 0;
      n = 20;
    }
    if( x.Y<0 ){
      zBuf[0] = '-';
      sqlite3_result_text(context, zBuf, n, SQLITE_TRANSIENT);
    }else{
      sqlite3_result_text(context, &zBuf[1], n-1, SQLITE_TRANSIENT);
    }
  }
}